

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMElementImpl.cpp
# Opt level: O3

DOMElement * __thiscall xercesc_4_0::DOMElementImpl::getLastElementChild(DOMElementImpl *this)

{
  int iVar1;
  undefined4 extraout_var;
  DOMElement *pDVar2;
  undefined4 extraout_var_00;
  DOMElementImpl *this_00;
  DOMElementImpl *n;
  
  iVar1 = (*(this->super_DOMElement).super_DOMNode._vptr_DOMNode[8])();
  n = (DOMElementImpl *)CONCAT44(extraout_var,iVar1);
  do {
    if (n == (DOMElementImpl *)0x0) {
      return (DOMElement *)0x0;
    }
    this_00 = n;
    iVar1 = (*(n->super_DOMElement).super_DOMNode._vptr_DOMNode[4])();
    if (iVar1 == 5) {
      pDVar2 = getLastElementChild(this_00,(DOMNode *)n);
      if (pDVar2 != (DOMElement *)0x0) {
        return pDVar2;
      }
    }
    else if (iVar1 == 1) {
      return &n->super_DOMElement;
    }
    iVar1 = (*(n->super_DOMElement).super_DOMNode._vptr_DOMNode[9])(n);
    n = (DOMElementImpl *)CONCAT44(extraout_var_00,iVar1);
  } while( true );
}

Assistant:

DOMElement * DOMElementImpl::getLastElementChild() const
{
    DOMNode* n = getLastChild();
    while (n != NULL) {
        switch (n->getNodeType()) {
            case DOMNode::ELEMENT_NODE:
                return (DOMElement*) n;
            case DOMNode::ENTITY_REFERENCE_NODE:
                {
                    DOMElement* e = getLastElementChild(n);
                    if (e != NULL)
                        return e;
                }
                break;
            default:
                break;
        }
        n = n->getPreviousSibling();
    }
    return NULL;
}